

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void writeOldRawSolution(FILE *file,HighsLogOptions *log_options,HighsLp *lp,HighsBasis *basis,
                        HighsSolution *solution)

{
  ostream *poVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  HighsInt iCol;
  long lVar5;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> use_row_status;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> use_col_status;
  vector<double,_std::allocator<double>_> use_row_dual;
  vector<double,_std::allocator<double>_> use_col_dual;
  vector<double,_std::allocator<double>_> use_row_value;
  vector<double,_std::allocator<double>_> use_col_value;
  stringstream ss;
  string local_2b8;
  allocator local_291;
  FILE *local_290;
  HighsLogOptions *local_288;
  HighsLp *local_280;
  _Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_278;
  _Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_258;
  _Vector_base<double,_std::allocator<double>_> local_238;
  _Vector_base<double,_std::allocator<double>_> local_218;
  _Vector_base<double,_std::allocator<double>_> local_1f8;
  _Vector_base<double,_std::allocator<double>_> local_1d8;
  undefined1 local_1b8 [24];
  string local_1a0 [368];
  
  bVar2 = solution->value_valid;
  bVar3 = solution->dual_valid;
  bVar4 = basis->valid;
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290 = file;
  local_288 = log_options;
  local_280 = lp;
  if (bVar2 == true) {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_1d8,&solution->col_value);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_1f8,&solution->row_value);
  }
  if (bVar3 != false) {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_218,&solution->col_dual);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_238,&solution->row_dual);
  }
  if (bVar4 == false) {
    if (((bVar2 | bVar3) & 1U) == 0) goto LAB_00265d4a;
  }
  else {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)&local_258,
               &basis->col_status);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)&local_278,
               &basis->row_status);
  }
  highsFormatToString_abi_cxx11_
            ((string *)local_1b8,
             "%d %d : Number of columns and rows for primal or dual solution or basis\n",
             (ulong)(uint)local_280->num_col_,(ulong)(uint)local_280->num_row_);
  highsFprintfString(local_290,local_288,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (bVar2 == false) {
    highsFormatToString_abi_cxx11_(&local_2b8,"F");
    std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_2b8);
  }
  else {
    highsFormatToString_abi_cxx11_(&local_2b8,"T");
    std::operator<<((ostream *)(local_1b8 + 0x10),(string *)&local_2b8);
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  highsFormatToString_abi_cxx11_(&local_2b8," Primal solution\n");
  poVar1 = (ostream *)(local_1b8 + 0x10);
  std::operator<<(poVar1,(string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::stringbuf::str();
  highsFprintfString(local_290,local_288,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (bVar3 == false) {
    highsFormatToString_abi_cxx11_(&local_2b8,"F");
    std::operator<<(poVar1,(string *)&local_2b8);
  }
  else {
    highsFormatToString_abi_cxx11_(&local_2b8,"T");
    std::operator<<(poVar1,(string *)&local_2b8);
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  highsFormatToString_abi_cxx11_(&local_2b8," Dual solution\n");
  std::operator<<(poVar1,(string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::stringbuf::str();
  highsFprintfString(local_290,local_288,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (bVar4 == false) {
    highsFormatToString_abi_cxx11_(&local_2b8,"F");
    std::operator<<(poVar1,(string *)&local_2b8);
  }
  else {
    highsFormatToString_abi_cxx11_(&local_2b8,"T");
    std::operator<<(poVar1,(string *)&local_2b8);
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  highsFormatToString_abi_cxx11_(&local_2b8," Basis\n");
  std::operator<<(poVar1,(string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::stringbuf::str();
  highsFprintfString(local_290,local_288,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::string((string *)&local_2b8,"Columns\n",&local_291);
  highsFprintfString(local_290,local_288,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  for (lVar5 = 0; lVar5 < local_280->num_col_; lVar5 = lVar5 + 1) {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)&local_2b8);
    if (bVar2 != false) {
      highsFormatToString_abi_cxx11_
                (&local_2b8,"%.15g ",
                 SUB84(local_1d8._M_impl.super__Vector_impl_data._M_start[lVar5],0));
      std::operator<<(poVar1,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    if (bVar3 != false) {
      highsFormatToString_abi_cxx11_
                (&local_2b8,"%.15g ",
                 SUB84(local_218._M_impl.super__Vector_impl_data._M_start[lVar5],0));
      std::operator<<(poVar1,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    if (bVar4 != false) {
      highsFormatToString_abi_cxx11_
                (&local_2b8,"%d",(ulong)local_258._M_impl.super__Vector_impl_data._M_start[lVar5]);
      std::operator<<(poVar1,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    highsFormatToString_abi_cxx11_(&local_2b8,"\n");
    std::operator<<(poVar1,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::stringbuf::str();
    highsFprintfString(local_290,local_288,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::__cxx11::string::string((string *)&local_2b8,"Rows\n",&local_291);
  highsFprintfString(local_290,local_288,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  for (lVar5 = 0; lVar5 < local_280->num_row_; lVar5 = lVar5 + 1) {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)&local_2b8);
    if (bVar2 != false) {
      highsFormatToString_abi_cxx11_
                (&local_2b8,"%.15g ",
                 SUB84(local_1f8._M_impl.super__Vector_impl_data._M_start[lVar5],0));
      std::operator<<(poVar1,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    if (bVar3 != false) {
      highsFormatToString_abi_cxx11_
                (&local_2b8,"%.15g ",
                 SUB84(local_238._M_impl.super__Vector_impl_data._M_start[lVar5],0));
      std::operator<<(poVar1,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    if (bVar4 != false) {
      highsFormatToString_abi_cxx11_
                (&local_2b8,"%d",(ulong)local_278._M_impl.super__Vector_impl_data._M_start[lVar5]);
      std::operator<<(poVar1,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    highsFormatToString_abi_cxx11_(&local_2b8,"\n");
    std::operator<<(poVar1,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::stringbuf::str();
    highsFprintfString(local_290,local_288,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
LAB_00265d4a:
  std::_Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::~_Vector_base(&local_278);
  std::_Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::~_Vector_base(&local_258);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_238);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_218);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1f8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1d8);
  return;
}

Assistant:

void writeOldRawSolution(FILE* file, const HighsLogOptions& log_options,
                         const HighsLp& lp, const HighsBasis& basis,
                         const HighsSolution& solution) {
  const bool have_value = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  const bool have_basis = basis.valid;
  vector<double> use_col_value;
  vector<double> use_row_value;
  vector<double> use_col_dual;
  vector<double> use_row_dual;
  vector<HighsBasisStatus> use_col_status;
  vector<HighsBasisStatus> use_row_status;
  if (have_value) {
    use_col_value = solution.col_value;
    use_row_value = solution.row_value;
  }
  if (have_dual) {
    use_col_dual = solution.col_dual;
    use_row_dual = solution.row_dual;
  }
  if (have_basis) {
    use_col_status = basis.col_status;
    use_row_status = basis.row_status;
  }
  if (!have_value && !have_dual && !have_basis) return;
  highsFprintfString(
      file, log_options,
      highsFormatToString(
          "%" HIGHSINT_FORMAT " %" HIGHSINT_FORMAT
          " : Number of columns and rows for primal or dual solution "
          "or basis\n",
          lp.num_col_, lp.num_row_));
  std::stringstream ss;
  ss.str(std::string());
  if (have_value) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Primal solution\n");
  highsFprintfString(file, log_options, ss.str());
  ss.str(std::string());
  if (have_dual) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Dual solution\n");
  highsFprintfString(file, log_options, ss.str());
  ss.str(std::string());
  if (have_basis) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Basis\n");
  highsFprintfString(file, log_options, ss.str());
  highsFprintfString(file, log_options, "Columns\n");
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    ss.str(std::string());
    if (have_value) ss << highsFormatToString("%.15g ", use_col_value[iCol]);
    if (have_dual) ss << highsFormatToString("%.15g ", use_col_dual[iCol]);
    if (have_basis)
      ss << highsFormatToString("%" HIGHSINT_FORMAT "",
                                (HighsInt)use_col_status[iCol]);
    ss << highsFormatToString("\n");
    highsFprintfString(file, log_options, ss.str());
  }
  highsFprintfString(file, log_options, "Rows\n");
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    ss.str(std::string());
    if (have_value) ss << highsFormatToString("%.15g ", use_row_value[iRow]);
    if (have_dual) ss << highsFormatToString("%.15g ", use_row_dual[iRow]);
    if (have_basis)
      ss << highsFormatToString("%" HIGHSINT_FORMAT "",
                                (HighsInt)use_row_status[iRow]);
    ss << highsFormatToString("\n");
    highsFprintfString(file, log_options, ss.str());
  }
}